

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

HeapType __thiscall
wasm::Random::pick<wasm::HeapType>(Random *this,FeatureOptions<wasm::HeapType> *picker)

{
  uintptr_t uVar1;
  value_type *pvVar2;
  _Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_30;
  
  items<wasm::HeapType>
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_30,this,picker);
  pvVar2 = pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                     (this,(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_30);
  uVar1 = pvVar2->id;
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base(&local_30);
  return (HeapType)uVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }